

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

QString * QFileSystemEngine::resolveUserName(uint userId)

{
  long lVar1;
  passwd *data;
  __uid_t in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  passwd *pw;
  QString *size;
  undefined4 in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  size = in_RDI;
  data = getpwuid(in_ESI);
  if (data == (passwd *)0x0) {
    QString::QString((QString *)0x211136);
  }
  else {
    QByteArray::QByteArray
              ((QByteArray *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),(char *)data,(qsizetype)size
              );
    QFile::decodeName((QByteArray *)in_RDI);
    QByteArray::~QByteArray((QByteArray *)0x21112b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return size;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemEngine::resolveUserName(uint userId)
{
#if QT_CONFIG(thread) && defined(_POSIX_THREAD_SAFE_FUNCTIONS) && !defined(Q_OS_OPENBSD)
    long size_max = sysconf(_SC_GETPW_R_SIZE_MAX);
    if (size_max == -1)
        size_max = 1024;
    QVarLengthArray<char, 1024> buf(size_max);
#endif

#if !defined(Q_OS_INTEGRITY) && !defined(Q_OS_WASM)
    struct passwd *pw = nullptr;
#if QT_CONFIG(thread) && defined(_POSIX_THREAD_SAFE_FUNCTIONS) && !defined(Q_OS_OPENBSD) && !defined(Q_OS_VXWORKS)
    struct passwd entry;
    getpwuid_r(userId, &entry, buf.data(), buf.size(), &pw);
#else
    pw = getpwuid(userId);
#endif
    if (pw)
        return QFile::decodeName(QByteArray(pw->pw_name));
#else // Integrity || WASM
    Q_UNUSED(userId);
#endif
    return QString();
}